

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O1

_Bool evaluate_block_definition(Scope *scope,BlockDefinition *block_definition)

{
  BlockDefinitionType BVar1;
  char *name;
  _Bool _Var2;
  byte bVar3;
  Scope *scope_00;
  Value *pVVar4;
  GeneratorValue *value;
  GeneratorValue *generator_value;
  bool bVar5;
  Expression *expression;
  ulong uVar6;
  byte unaff_R13B;
  GeneratorValue *local_38;
  
  bVar5 = false;
  bVar3 = true;
  while (BVar1 = block_definition->block_definition_type,
        BVar1 == BlockDefinitionTypeIfElseGroupBlock) {
    if (*(long *)(block_definition + 2) == 0) {
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      do {
        _Var2 = evaluate_block_definition
                          (scope,*(BlockDefinition **)(*(long *)(block_definition + 4) + uVar6 * 8))
        ;
        if (_Var2) break;
        uVar6 = uVar6 + 1;
      } while (uVar6 < *(ulong *)(block_definition + 2));
    }
    if ((uVar6 != *(ulong *)(block_definition + 2)) ||
       (block_definition = *(BlockDefinition **)(block_definition + 6),
       block_definition == (BlockDefinition *)0x0)) goto LAB_00108819;
    unaff_R13B = unaff_R13B | bVar5 ^ 1U;
    bVar5 = true;
  }
  if (BVar1 == BlockDefinitionTypeIfBlock) {
    scope_00 = new_scope(scope,*(Block **)(block_definition + 2),ScopeTypeNormalScope);
    if (*(Expression **)(block_definition + 4) != (Expression *)0x0) {
      pVVar4 = evaluate_expression(scope_00,*(Expression **)(block_definition + 4));
      free_value(pVVar4);
    }
    local_38 = (GeneratorValue *)
               evaluate_expression(scope_00,*(Expression **)(block_definition + 6));
    bVar3 = convert_to_bool((Value *)local_38);
    if ((bool)bVar3) {
      pVVar4 = evaluate_scope(scope_00);
      free_value(pVVar4);
    }
LAB_001087e3:
    free_value(&local_38->value);
  }
  else {
    if (BVar1 != BlockDefinitionTypeElseBlock) {
      if (BVar1 != BlockDefinitionTypeForBlock) goto LAB_00108819;
      scope_00 = new_scope(scope,*(Block **)(block_definition + 2),ScopeTypeNormalScope);
      if (*(Expression **)(block_definition + 4) != (Expression *)0x0) {
        pVVar4 = evaluate_expression(scope_00,*(Expression **)(block_definition + 4));
        free_value(pVVar4);
      }
      expression = *(Expression **)(block_definition + 6);
      if ((expression->expression_type == ExpressionTypeInfixExpression) &&
         (expression[1].expression_type == 0x1a)) {
        name = *(char **)(*(long *)(expression[1].literal + 2) + 8);
        value = (GeneratorValue *)evaluate_expression(scope_00,*(Expression **)(expression + 2));
        if ((value->value).value_type == ValueTypeGeneratorValue) {
          local_38 = (GeneratorValue *)0x0;
          generator_value = value;
        }
        else {
          generator_value = (GeneratorValue *)convert_to_generator_value((Value *)value);
          local_38 = value;
        }
        while (pVVar4 = fetch_value_from_generator_value(generator_value),
              pVVar4->value_type != ValueTypeNullValue) {
          scope_set_variable(scope_00,ValueTypeNullValue,name,pVVar4,0);
          pVVar4 = evaluate_scope(scope_00);
          free_value(pVVar4);
        }
        free_value(&generator_value->value);
        if (local_38 == (GeneratorValue *)0x0) goto LAB_00108814;
      }
      else {
        while( true ) {
          local_38 = (GeneratorValue *)evaluate_expression(scope_00,expression);
          _Var2 = convert_to_bool((Value *)local_38);
          if (!_Var2) break;
          free_value((Value *)local_38);
          pVVar4 = evaluate_scope(scope_00);
          free_value(pVVar4);
          if (*(Expression **)(block_definition + 8) != (Expression *)0x0) {
            pVVar4 = evaluate_expression(scope_00,*(Expression **)(block_definition + 8));
            free_value(pVVar4);
          }
          expression = *(Expression **)(block_definition + 6);
        }
      }
      goto LAB_001087e3;
    }
    scope_00 = new_scope(scope,*(Block **)(block_definition + 2),ScopeTypeNormalScope);
    pVVar4 = evaluate_scope(scope_00);
    free_value(pVVar4);
  }
LAB_00108814:
  free_scope(scope_00);
LAB_00108819:
  if (bVar5) {
    bVar3 = unaff_R13B;
  }
  return (_Bool)(bVar3 & 1);
}

Assistant:

bool evaluate_block_definition(Scope *scope, BlockDefinition *block_definition) {
  Scope *block_scope = NULL;

  switch (block_definition->block_definition_type) {
    case BlockDefinitionTypeIfElseGroupBlock: {
      IfElseGroupBlockDefinition *if_else_group_block_definition = (IfElseGroupBlockDefinition *) block_definition;

      size_t i;

      for (i = 0; i < if_else_group_block_definition->if_block_definitions_length; i++) {
        if (evaluate_block_definition(scope, (BlockDefinition *) if_else_group_block_definition->if_block_definitions[i])) {
          break;
        }
      }

      if (i == if_else_group_block_definition->if_block_definitions_length && if_else_group_block_definition->else_block_definition != NULL) {
        evaluate_block_definition(scope, (BlockDefinition *) if_else_group_block_definition->else_block_definition);
      }

      return true;
    }

    case BlockDefinitionTypeIfBlock: {
      IfBlockDefinition *if_block_definition = (IfBlockDefinition *) block_definition;

      block_scope = new_scope(scope, if_block_definition->block, ScopeTypeNormalScope);

      if (if_block_definition->pre_expression != NULL) {
        free_value(evaluate_expression(block_scope, if_block_definition->pre_expression));
      }

      Value *condition_value = evaluate_expression(block_scope, if_block_definition->condition);
      bool condition = convert_to_bool(condition_value);

      if (condition) {
        free_value(evaluate_scope(block_scope));
      }

      free_value(condition_value);
      free_scope(block_scope);

      return condition;
    }

    case BlockDefinitionTypeElseBlock: {
      ElseBlockDefinition *else_block_definition = (ElseBlockDefinition *) block_definition;

      block_scope = new_scope(scope, else_block_definition->block, ScopeTypeNormalScope);

      free_value(evaluate_scope(block_scope));
      free_scope(block_scope);

      return true;
    }

    case BlockDefinitionTypeForBlock: {
      ForBlockDefinition *for_block_definition = (ForBlockDefinition *) block_definition;

      block_scope = new_scope(scope, for_block_definition->block, ScopeTypeNormalScope);

      if (for_block_definition->pre_expression != NULL) {
        free_value(evaluate_expression(block_scope, for_block_definition->pre_expression));
      }

      if (for_block_definition->condition->expression_type == ExpressionTypeInfixExpression && (((InfixExpression *) for_block_definition->condition)->operator == IN_OP)) {
        InfixExpression *in_infix_expression = (InfixExpression *) for_block_definition->condition;

        char *identifier = ((StringLiteral *) in_infix_expression->left_expression->literal)->string_literal;

        Value *right_value = evaluate_expression(block_scope, in_infix_expression->right_expression);
        GeneratorValue *generator_value;

        if (right_value->value_type == ValueTypeGeneratorValue) {
          generator_value = (GeneratorValue *) right_value;
          right_value = NULL;
        }
        else {
          generator_value = (GeneratorValue *) convert_to_generator_value(right_value);
        }

        Value *for_block_value;

        while ((for_block_value = fetch_value_from_generator_value(generator_value))->value_type != ValueTypeNullValue) {
          scope_set_variable(block_scope, ValueTypeNullValue, identifier, for_block_value, false);

          free_value(evaluate_scope(block_scope));
        }

        free_value((Value *) generator_value);
        if (right_value != NULL) free_value(right_value);
        free_scope(block_scope);
      }
      else {
        Value *condition_value = evaluate_expression(block_scope, for_block_definition->condition);

        while (convert_to_bool(condition_value)) {
          free_value(condition_value);

          Value *value = evaluate_scope(block_scope);
          free_value(value);

          if (for_block_definition->post_expression != NULL) {
            free_value(evaluate_expression(block_scope, for_block_definition->post_expression));
          }

          condition_value = evaluate_expression(block_scope, for_block_definition->condition);
        }

        free_value(condition_value);
        free_scope(block_scope);
      }

      return true;
    }

    default: {
      return true;
    }
  }
}